

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple9_rle.h
# Opt level: O3

uint32_t FastPForLib::Simple9_Codec::Decompress
                   (uint32_t *input,uint32_t inOffset,uint32_t *output,uint32_t outOffset,
                   uint32_t outCount)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  uint32_t inPos;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  
  uVar5 = outCount + outOffset;
  uVar3 = (ulong)inOffset;
  if (outOffset < uVar5) {
    do {
      uVar7 = input[uVar3];
      uVar10 = (ulong)((uVar7 >> 0x1c) << 2);
      uVar4 = *(uint *)((long)&Simple9_Codec_intNumber + uVar10);
      uVar1 = *(uint *)((long)&Simple9_Codec_bitLength + uVar10);
      uVar2 = uVar5 - outOffset;
      if (uVar4 < uVar5 - outOffset) {
        uVar2 = uVar4;
      }
      uVar4 = ~(-1 << (uVar1 & 0x1f));
      if (uVar2 == 0) {
        uVar10 = 0;
      }
      else {
        uVar9 = 0;
        do {
          uVar6 = uVar7 >> (uVar1 & 0x1f);
          uVar8 = (int)uVar9 + 7;
          uVar10 = (ulong)uVar8;
          output[outOffset + uVar9] = uVar7 & uVar4;
          uVar11 = uVar6 >> (uVar1 & 0x1f);
          output[(ulong)outOffset + uVar9 + 1] = uVar6 & uVar4;
          uVar7 = uVar11 >> (uVar1 & 0x1f);
          output[(ulong)outOffset + uVar9 + 2] = uVar11 & uVar4;
          uVar12 = uVar7 >> (uVar1 & 0x1f);
          output[(ulong)outOffset + uVar9 + 3] = uVar7 & uVar4;
          uVar6 = uVar12 >> (uVar1 & 0x1f);
          uVar11 = uVar6 >> (uVar1 & 0x1f);
          output[(ulong)outOffset + uVar9 + 4] = uVar12 & uVar4;
          uVar7 = uVar11 >> (uVar1 & 0x1f);
          output[(ulong)outOffset + uVar9 + 5] = uVar6 & uVar4;
          output[(ulong)outOffset + uVar9 + 6] = uVar11 & uVar4;
          uVar9 = uVar10;
        } while (uVar8 < uVar2);
      }
      if ((uint)uVar10 < uVar2) {
        do {
          output[outOffset + uVar10] = uVar7 & uVar4;
          uVar10 = uVar10 + 1;
          uVar7 = uVar7 >> (uVar1 & 0x1f);
        } while (uVar2 != uVar10);
      }
      inOffset = (int)uVar3 + 1;
      uVar3 = (ulong)inOffset;
      outOffset = outOffset + uVar2;
    } while (outOffset < uVar5);
  }
  return inOffset;
}

Assistant:

static uint32_t Decompress(const uint32_t *input, uint32_t inOffset,
                             uint32_t *output, uint32_t outOffset,
                             uint32_t outCount) {
    uint32_t inPos = inOffset;
    uint32_t outPos = outOffset;
    uint32_t outEnd = outOffset + outCount;

    while (outPos < outEnd) {
      uint32_t remainingCount = outEnd - outPos;

      uint32_t val = input[inPos++];
      uint32_t code = val >> SIMPLE9_BITSIZE;

#if defined(_SIMPLE9_USE_RLE)
      if (code == RLE_SELECTOR_VALUE) {
        // decode rle-encoded integers
        uint32_t repeatValue = val & RLE_MAX_VALUE_MASK;
        uint32_t repeatCount = (val >> RLE_MAX_VALUE_BITS) & RLE_MAX_COUNT_MASK;
        repeatCount =
            (repeatCount < remainingCount) ? repeatCount : remainingCount;

        for (uint32_t i = 0; i < repeatCount; ++i) {
          output[outPos++] = repeatValue;
        }
      }
#else
      // optional check for end-of-stream
      if (SIMPLE9_MINCODE == 1 && code == 0) {
        break; // end of stream
      }
#endif
      else {
        // decode bit-packed integers
        uint32_t intNum = Simple9_Codec_intNumber[code];
        uint32_t bitLen = Simple9_Codec_bitLength[code];
        uint32_t bitMask = (1U << bitLen) - 1;
        intNum = (intNum < remainingCount)
                     ? intNum
                     : remainingCount; // optional buffer end check

#if defined(_DONT_UNROLL_LOOP)
        for (uint32_t i = 0; i < intNum; ++i) {
          output[outPos++] = val & bitMask;
          val >>= bitLen;
        }
#else
        uint32_t i = 0;
        for (; i < intNum; i += 7) {
          auto out = output + outPos + i;
          out[0] = val & bitMask;
          val >>= bitLen;
          out[1] = val & bitMask;
          val >>= bitLen;
          out[2] = val & bitMask;
          val >>= bitLen;
          out[3] = val & bitMask;
          val >>= bitLen;
          out[4] = val & bitMask;
          val >>= bitLen;
          out[5] = val & bitMask;
          val >>= bitLen;
          out[6] = val & bitMask;
          val >>= bitLen;
        }
        for (; i < intNum; ++i) {
          auto out = output + outPos + i;
          out[0] = val & bitMask;
          val >>= bitLen;
        }
        outPos += intNum;
#endif
      }
    }